

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall
Board::filter_illegal_moves
          (Board *this,
          map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
          *possible_moves,
          map<Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
          *possible_play_moves,Color color,uint turn)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *point;
  bool bVar1;
  pointer ppVar2;
  reference pPVar3;
  shared_ptr<Piece> *psVar4;
  pointer ppVar5;
  pointer ppVar6;
  Point local_10c;
  undefined1 local_108 [3];
  bool king_threatened_1;
  Point king_position;
  map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
  endangered_pieces;
  _Self local_d0;
  iterator possible_play;
  _Self local_c0;
  iterator possible_plays;
  shared_ptr<Piece> local_88;
  Point local_72;
  byte local_6d;
  bool king_threatened;
  undefined1 local_60 [8];
  shared_ptr<Piece> original;
  Point destination;
  Point source;
  _Self local_40;
  iterator move;
  _Self local_30;
  iterator moves;
  uint turn_local;
  Color color_local;
  map<Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
  *possible_play_moves_local;
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  *possible_moves_local;
  Board *this_local;
  
  moves._M_node._7_1_ = color & WHITE;
  moves._M_node._0_4_ = turn;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
       ::begin(possible_moves);
  while( true ) {
    move._M_node = (_Base_ptr)
                   std::
                   map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
                   ::end(possible_moves);
    bVar1 = std::operator!=(&local_30,(_Self *)&move);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>
             ::operator->(&local_30);
    local_40._M_node =
         (_Base_ptr)
         std::set<Point,_std::less<Point>,_std::allocator<Point>_>::begin(&ppVar2->second);
    while( true ) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>
               ::operator->(&local_30);
      _destination = std::set<Point,_std::less<Point>,_std::allocator<Point>_>::end(&ppVar2->second)
      ;
      bVar1 = std::operator!=(&local_40,(_Self *)&destination);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>
               ::operator->(&local_30);
      original.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           ppVar2->first;
      pPVar3 = std::_Rb_tree_const_iterator<Point>::operator*(&local_40);
      original.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           *pPVar3;
      point = &original.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      psVar4 = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[]
                         (&this->m_board,(Point *)point);
      std::shared_ptr<Piece>::shared_ptr((shared_ptr<Piece> *)local_60,psVar4);
      do_move(this,(uint)moves._M_node,
              (Point *)((long)&original.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 4),(Point *)point);
      local_72 = find_king(this,moves._M_node._7_1_ & WHITE);
      local_6d = is_threatened(this,&local_72,moves._M_node._7_1_ & WHITE,(uint)moves._M_node,true);
      std::shared_ptr<Piece>::shared_ptr(&local_88,(shared_ptr<Piece> *)local_60);
      undo_move(this,(Point *)((long)&original.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi + 4),
                (Point *)&original.super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ,&local_88);
      std::shared_ptr<Piece>::~shared_ptr(&local_88);
      if ((local_6d & 1) == 0) {
        std::_Rb_tree_const_iterator<Point>::operator++(&local_40,0);
      }
      else {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>
                 ::operator->(&local_30);
        local_40._M_node =
             (_Base_ptr)
             std::set<Point,std::less<Point>,std::allocator<Point>>::erase_abi_cxx11_
                       ((set<Point,std::less<Point>,std::allocator<Point>> *)&ppVar2->second,
                        local_40._M_node);
      }
      std::shared_ptr<Piece>::~shared_ptr((shared_ptr<Piece> *)local_60);
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>
             ::operator->(&local_30);
    bVar1 = std::set<Point,_std::less<Point>,_std::allocator<Point>_>::empty(&ppVar2->second);
    if (bVar1) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<Point,std::set<Point,std::less<Point>,std::allocator<Point>>,std::less<Point>,std::allocator<std::pair<Point_const,std::set<Point,std::less<Point>,std::allocator<Point>>>>>
           ::erase_abi_cxx11_((map<Point,std::set<Point,std::less<Point>,std::allocator<Point>>,std::less<Point>,std::allocator<std::pair<Point_const,std::set<Point,std::less<Point>,std::allocator<Point>>>>>
                               *)possible_moves,local_30._M_node);
    }
    else {
      possible_plays._M_node =
           (_Base_ptr)
           std::
           _Rb_tree_iterator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>
           ::operator++(&local_30,0);
    }
  }
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
       ::begin(possible_play_moves);
  while( true ) {
    possible_play._M_node =
         (_Base_ptr)
         std::
         map<Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
         ::end(possible_play_moves);
    bVar1 = std::operator!=(&local_c0,(_Self *)&possible_play);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>
             ::operator->(&local_c0);
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>
         ::begin(&ppVar5->second);
    while( true ) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>
               ::operator->(&local_c0);
      endangered_pieces._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>
                   ::end(&ppVar5->second);
      bVar1 = std::operator!=(&local_d0,
                              (_Self *)&endangered_pieces._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count);
      if (!bVar1) break;
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
               ::operator->(&local_d0);
      get_endangered_pieces
                ((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                  *)local_108,this,&ppVar6->second);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
               ::operator->(&local_d0);
      do_move(this,&ppVar6->second);
      local_10c = find_king(this,moves._M_node._7_1_ & WHITE);
      bVar1 = is_threatened(this,&local_10c,moves._M_node._7_1_ & WHITE,(uint)moves._M_node,true);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
               ::operator->(&local_d0);
      undo_move(this,(map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
                      *)local_108,&ppVar6->second);
      if (bVar1) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>
                 ::operator->(&local_c0);
        local_d0._M_node =
             (_Base_ptr)
             std::
             map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>
             ::erase_abi_cxx11_((map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>
                                 *)&ppVar5->second,local_d0._M_node);
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>
        ::operator++(&local_d0,0);
      }
      std::
      map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
      ::~map((map<Point,_std::shared_ptr<Piece>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::shared_ptr<Piece>_>_>_>
              *)local_108);
    }
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>
             ::operator->(&local_c0);
    bVar1 = std::
            map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>
            ::empty(&ppVar5->second);
    if (bVar1) {
      local_c0._M_node =
           (_Base_ptr)
           std::
           map<Point,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>>>
           ::erase_abi_cxx11_((map<Point,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::map<Point,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>,std::less<Point>,std::allocator<std::pair<Point_const,std::vector<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>,std::allocator<std::pair<std::shared_ptr<Piece>,std::shared_ptr<Piece>>>>>>>>>>
                               *)possible_play_moves,local_c0._M_node);
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>
      ::operator++(&local_c0,0);
    }
  }
  return;
}

Assistant:

void
Board::filter_illegal_moves(map<Point, set<Point>> &possible_moves, map<Point, map<Point, play>> &possible_play_moves,
                            Color color, unsigned int turn) {
    // Filter illegal normal moves.
    for (auto moves = possible_moves.begin(); moves != possible_moves.end();) {
        for (auto move = moves->second.begin(); move != moves->second.end();) {
            auto source = moves->first, destination = *move;
            shared_ptr<Piece> original = m_board[destination];
            do_move(turn, source, destination);
            bool king_threatened = is_threatened(find_king(color), color, turn, true);
            undo_move(source, destination, original);

            if (king_threatened) {
                // Move is illegal.
                move = moves->second.erase(move);
            } else {
                move++;
            }
        }

        if (moves->second.empty()) {
            moves = possible_moves.erase(moves);
        } else {
            moves++;
        }
    }

    // Filter illegal play moves.
    for (auto possible_plays = possible_play_moves.begin(); possible_plays != possible_play_moves.end();) {
        for (auto possible_play = possible_plays->second.begin(); possible_play != possible_plays->second.end();) {
            const auto endangered_pieces = get_endangered_pieces(possible_play->second);
            do_move(possible_play->second);
            const auto king_position = find_king(color);
            bool king_threatened = is_threatened(king_position, color, turn, true);
            undo_move(endangered_pieces, possible_play->second);

            if (king_threatened) {
                // Move is illegal.
                possible_play = possible_plays->second.erase(possible_play);
            } else {
                possible_play++;
            }
        }

        if (possible_plays->second.empty()) {
            possible_plays = possible_play_moves.erase(possible_plays);
        } else {
            possible_plays++;
        }
    }
}